

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int cfft2b_(int *ldim,int *l,int *m,fft_complex_t *c__,double *wsave,int *lensav,double *work,
           int *lenwrk,int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *in_R9;
  double dVar7;
  double dVar8;
  int *inc;
  int *jump;
  int *lenc;
  int *in_stack_00000010;
  undefined4 *in_stack_00000018;
  int ier1;
  int iw;
  int i__3;
  int i__2;
  int i__1;
  int c_offset;
  int c_dim1;
  int *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 uVar9;
  int iVar10;
  
  iVar10 = *in_RDI;
  iVar1 = iVar10 + 1;
  *in_stack_00000018 = 0;
  if (*in_RDI < *in_RSI) {
    *in_stack_00000018 = 5;
  }
  else {
    iVar4 = *in_R9;
    iVar2 = *in_RSI << 1;
    dVar7 = log((double)*in_RSI);
    dVar8 = log(2.0);
    iVar3 = iVar2 + (int)(dVar7 / dVar8);
    iVar5 = *in_RDX;
    dVar7 = log((double)*in_RDX);
    dVar8 = log(2.0);
    if (iVar4 < iVar3 + iVar5 * 2 + (int)(dVar7 / dVar8) + 8) {
      *in_stack_00000018 = 2;
    }
    else if (*in_stack_00000010 < *in_RSI * 2 * *in_RDX) {
      *in_stack_00000018 = 3;
    }
    else {
      iVar4 = *in_RSI << 1;
      inc = (int *)log((double)*in_RSI);
      dVar7 = log(2.0);
      iVar5 = iVar4 + (int)((double)inc / dVar7) + 3;
      iVar3 = *in_RSI + *in_RDI * (*in_RDX + -1);
      iVar6 = *in_RDX << 1;
      jump = (int *)log((double)*in_RDX);
      dVar7 = log(2.0);
      cfftmb_((int *)CONCAT44(iVar2,in_stack_ffffffffffffff80),jump,
              (int *)CONCAT44(iVar6,in_stack_ffffffffffffff70),inc,
              (fft_complex_t *)CONCAT44(iVar4,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58,
              (double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (int *)CONCAT44(*in_RSI * 2 * *in_RDX,iVar5),
              (double *)CONCAT44(iVar3,iVar6 + (int)((double)jump / dVar7) + 4),
              (int *)CONCAT44(iVar10,iVar1),in_R9);
      if (in_stack_ffffffffffffffa4 == 0) {
        uVar9 = 1;
        iVar3 = (*in_RDX + -1) * *in_RDI + *in_RSI;
        iVar5 = *in_RSI;
        lenc = (int *)log((double)*in_RSI);
        dVar7 = log(2.0);
        cfftmb_((int *)CONCAT44(iVar2,in_stack_ffffffffffffff80),jump,
                (int *)CONCAT44(iVar6,in_stack_ffffffffffffff70),inc,
                (fft_complex_t *)CONCAT44(iVar4,in_stack_ffffffffffffff60),lenc,
                (double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                (int *)CONCAT44(*in_RDX * 2 * *in_RSI,uVar9),
                (double *)CONCAT44(iVar3,iVar5 * 2 + (int)((double)lenc / dVar7) + 4),
                (int *)CONCAT44(iVar10,iVar1),in_R9);
        if (in_stack_ffffffffffffffa4 != 0) {
          *in_stack_00000018 = 0x14;
        }
      }
      else {
        *in_stack_00000018 = 0x14;
      }
    }
  }
  return 0;
}

Assistant:

int cfft2b_(int *ldim, int *l, int *m, complex *
	c__, fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk,
	int *ier)
{
    /* System generated locals */
    int c_dim1, c_offset, i__1, i__2, i__3;


    /* Local variables */
     int iw, ier1;
    extern /* Subroutine */ int cfftmb_(int *, int *, int *,
	    int *, complex *, int *, fft_real_t *, int *, fft_real_t *,
	    int *, int *), xerfft_(char *, int *, ftnlen);


/* Initialize error return */

    /* Parameter adjustments */
    c_dim1 = *ldim;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

    if (*l > *ldim) {
	*ier = 5;
	////xerfft_("CFFT2B", &c_n2, (ftnlen)6);
	goto L100;
    } else if (*lensav < (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0))
	    + (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 8) {
	*ier = 2;
	////xerfft_("CFFT2B", &c__6, (ftnlen)6);
	goto L100;
    } else if (*lenwrk < (*l << 1) * *m) {
	*ier = 3;
	////xerfft_("CFFT2B", &c__8, (ftnlen)6);
	goto L100;
    }

/* Transform X lines of C array */
    iw = (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 3;
    i__1 = *l - 1 + *ldim * (*m - 1) + 1;
    i__2 = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    i__3 = (*l << 1) * *m;
    cfftmb_(l, &c__1, m, ldim, &c__[c_offset], &i__1, &wsave[iw], &i__2, &
	    work[1], &i__3, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	////xerfft_("CFFT2B", &c_n5, (ftnlen)6);
	goto L100;
    }

/* Transform Y lines of C array */
    iw = 1;
    i__1 = (*m - 1) * *ldim + *l;
    i__2 = (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    i__3 = (*m << 1) * *l;
    cfftmb_(m, ldim, l, &c__1, &c__[c_offset], &i__1, &wsave[iw], &i__2, &
	    work[1], &i__3, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	////xerfft_("CFFT2B", &c_n5, (ftnlen)6);
    }

L100:
    return 0;
}